

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall soul::AST::TypeMetaFunction::throwErrorIfUnresolved(TypeMetaFunction *this)

{
  int iVar1;
  ExpressionKind EVar2;
  Expression *pEVar3;
  Type TStack_28;
  
  pEVar3 = (this->source).object;
  EVar2 = pEVar3->kind;
  if (EVar2 == value) {
    iVar1 = (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[3])(pEVar3);
    pEVar3 = (this->source).object;
    if ((char)iVar1 != '\0') {
      (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[4])(&TStack_28);
      throwErrorIfUnresolved(this,&TStack_28);
      goto LAB_0020984b;
    }
    EVar2 = pEVar3->kind;
  }
  if (EVar2 != type) {
    return;
  }
  iVar1 = (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[3])(pEVar3);
  if ((char)iVar1 == '\0') {
    return;
  }
  (*(((this->source).object)->super_Statement).super_ASTObject._vptr_ASTObject[5])(&TStack_28);
  throwErrorIfUnresolved(this,&TStack_28);
LAB_0020984b:
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&TStack_28.structure);
  return;
}

Assistant:

void throwErrorIfUnresolved() const
        {
            if (isResolvedAsValue (source.get()))
                throwErrorIfUnresolved (source->getResultType());
            else if (isResolvedAsType (source.get()))
                throwErrorIfUnresolved (source->resolveAsType());
        }